

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantSetSuppStart(Gia_Man_t *p)

{
  uint __line;
  Vec_Wrd_t *p_00;
  char *__assertion;
  
  if (p->nObjs == 1) {
    if (p->vSuppWords == (Vec_Wrd_t *)0x0) {
      if ((p->vSuppVars).nSize == 0) {
        p->iSuppPi = 0;
        p->nSuppWords = 1;
        p_00 = Vec_WrdAlloc(1000);
        p->vSuppWords = p_00;
        Vec_WrdPush(p_00,0);
        return;
      }
      __assertion = "Vec_IntSize(&p->vSuppVars) == 0";
      __line = 0x68;
    }
    else {
      __assertion = "p->vSuppWords == NULL";
      __line = 0x67;
    }
  }
  else {
    __assertion = "Gia_ManObjNum(p) == 1";
    __line = 0x66;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                ,__line,"void Gia_ManQuantSetSuppStart(Gia_Man_t *)");
}

Assistant:

void Gia_ManQuantSetSuppStart( Gia_Man_t * p )
{
    assert( Gia_ManObjNum(p) == 1 );
    assert( p->vSuppWords == NULL );
    assert( Vec_IntSize(&p->vSuppVars) == 0 );
    p->iSuppPi    = 0;
    p->nSuppWords = 1;
    p->vSuppWords = Vec_WrdAlloc( 1000 );
    Vec_WrdPush( p->vSuppWords, 0 );
}